

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O0

CURLcode Curl_resolver_wait_resolv(connectdata *conn,Curl_dns_entry **entry)

{
  int iVar1;
  CURLcode local_24;
  CURLcode result;
  thread_data *td;
  Curl_dns_entry **entry_local;
  connectdata *conn_local;
  
  local_24 = CURLE_OK;
  iVar1 = Curl_thread_join((pthread_t **)(conn->async).os_specific);
  if (iVar1 != 0) {
    local_24 = getaddrinfo_complete(conn);
  }
  (conn->async).done = true;
  if (entry != (Curl_dns_entry **)0x0) {
    *entry = (conn->async).dns;
  }
  if ((conn->async).dns == (Curl_dns_entry *)0x0) {
    local_24 = resolver_error(conn);
  }
  destroy_async_data(&conn->async);
  if ((conn->async).dns == (Curl_dns_entry *)0x0) {
    Curl_conncontrol(conn,1);
  }
  return local_24;
}

Assistant:

CURLcode Curl_resolver_wait_resolv(struct connectdata *conn,
                                   struct Curl_dns_entry **entry)
{
  struct thread_data   *td = (struct thread_data*) conn->async.os_specific;
  CURLcode result = CURLE_OK;

  DEBUGASSERT(conn && td);

  /* wait for the thread to resolve the name */
  if(Curl_thread_join(&td->thread_hnd))
    result = getaddrinfo_complete(conn);
  else
    DEBUGASSERT(0);

  conn->async.done = TRUE;

  if(entry)
    *entry = conn->async.dns;

  if(!conn->async.dns)
    /* a name was not resolved, report error */
    result = resolver_error(conn);

  destroy_async_data(&conn->async);

  if(!conn->async.dns)
    connclose(conn, "asynch resolve failed");

  return result;
}